

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForX11Event(double *timeout)

{
  int iVar1;
  GLFWbool GVar2;
  pollfd local_20;
  pollfd fd;
  double *timeout_local;
  
  local_20.fd = *(int *)(_glfw.x11.display + 0x10);
  local_20.events = 1;
  local_20.revents = 0;
  fd = (pollfd)timeout;
  do {
    iVar1 = XPending(_glfw.x11.display);
    if (iVar1 != 0) {
      return 1;
    }
    GVar2 = waitForData(&local_20,1,(double *)fd);
  } while (GVar2 != 0);
  return 0;
}

Assistant:

static GLFWbool waitForX11Event(double* timeout)
{
    struct pollfd fd = { ConnectionNumber(_glfw.x11.display), POLLIN };

    while (!XPending(_glfw.x11.display))
    {
        if (!waitForData(&fd, 1, timeout))
            return GLFW_FALSE;
    }

    return GLFW_TRUE;
}